

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O2

string * formatTime_abi_cxx11_(string *__return_storage_ptr__,time_t seconds)

{
  ulong uVar1;
  char *__format;
  float fVar2;
  allocator<char> local_29;
  char formatted [24];
  
  fVar2 = (float)seconds / 86400.0;
  if (seconds < 0x1e13380) {
    if (seconds < 0x6ebe00) {
      if (seconds < 0x112380) {
        if (seconds < 0x15180) {
          if (seconds < 0xe10) {
            if (seconds < 0x3c) {
              if (seconds < 1) {
                formatted[0] = '-';
                formatted[1] = '\0';
                goto LAB_00110fae;
              }
              __format = "%d s";
              uVar1 = seconds & 0xffffffff;
            }
            else {
              uVar1 = (ulong)(ushort)((ushort)seconds / 0x3c);
              __format = "%d m";
            }
          }
          else {
            uVar1 = (seconds & 0xffffffffU) / 0xe10;
            __format = "%d h";
          }
        }
        else {
          uVar1 = (ulong)(uint)(int)fVar2;
          __format = "%d d";
        }
      }
      else {
        uVar1 = (ulong)(uint)(int)(fVar2 / 7.0);
        __format = "%d wk";
      }
    }
    else {
      uVar1 = (ulong)(uint)(int)(fVar2 / 30.0);
      __format = "%1d mo";
    }
    snprintf(formatted,0x18,__format,uVar1);
  }
  else {
    snprintf(formatted,0x18,"%.1f y",(double)fVar2 / 365.0);
  }
LAB_00110fae:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,formatted,&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string formatTime (time_t seconds)
{
  char formatted[24];
  float days = (float) seconds / 86400.0;

       if (seconds >= 86400 * 365) snprintf (formatted, sizeof(formatted), "%.1f y", (days / 365.0));
  else if (seconds >= 86400 * 84)  snprintf (formatted, sizeof(formatted), "%1d mo", (int) (days / 30));
  else if (seconds >= 86400 * 13)  snprintf (formatted, sizeof(formatted), "%d wk",  (int) (float) (days / 7.0));
  else if (seconds >= 86400)       snprintf (formatted, sizeof(formatted), "%d d",   (int) days);
  else if (seconds >= 3600)        snprintf (formatted, sizeof(formatted), "%d h",   (int) (seconds / 3600));
  else if (seconds >= 60)          snprintf (formatted, sizeof(formatted), "%d m",   (int) (seconds / 60));
  else if (seconds >= 1)           snprintf (formatted, sizeof(formatted), "%d s",   (int) seconds);
#ifdef HAVE_STRLCPY
  else                             strlcpy (formatted, "-", sizeof(formatted));
#else
  else                             strcpy (formatted, "-");
#endif /* HAVE_STRLCPY */

  return std::string (formatted);
}